

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O3

bool duckdb::AddPropagateStatistics::Operation<int,duckdb::TryDecimalAdd>
               (LogicalType *type,BaseStatistics *lstats,BaseStatistics *rstats,Value *new_min,
               Value *new_max)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Value local_70;
  
  iVar1 = NumericStats::GetMin<int>(lstats);
  iVar2 = NumericStats::GetMin<int>(rstats);
  if (iVar2 < 0) {
    if (iVar1 < -999999999 - iVar2) {
      return true;
    }
  }
  else if (999999999 - iVar2 < iVar1) {
    return true;
  }
  iVar3 = NumericStats::GetMax<int>(lstats);
  iVar4 = NumericStats::GetMax<int>(rstats);
  if (iVar4 < 0) {
    if (iVar3 < -999999999 - iVar4) {
      return true;
    }
  }
  else if (999999999 - iVar4 < iVar3) {
    return true;
  }
  Value::Numeric(&local_70,type,(long)(iVar2 + iVar1));
  Value::operator=(new_min,&local_70);
  Value::~Value(&local_70);
  Value::Numeric(&local_70,type,(long)(iVar4 + iVar3));
  Value::operator=(new_max,&local_70);
  Value::~Value(&local_70);
  return false;
}

Assistant:

static bool Operation(const LogicalType &type, BaseStatistics &lstats, BaseStatistics &rstats, Value &new_min,
	                      Value &new_max) {
		T min, max;
		// new min is min+min
		if (!OP::Operation(NumericStats::GetMin<T>(lstats), NumericStats::GetMin<T>(rstats), min)) {
			return true;
		}
		// new max is max+max
		if (!OP::Operation(NumericStats::GetMax<T>(lstats), NumericStats::GetMax<T>(rstats), max)) {
			return true;
		}
		new_min = Value::Numeric(type, min);
		new_max = Value::Numeric(type, max);
		return false;
	}